

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xstring.c
# Opt level: O1

char * xultoa(char *buf,unsigned_long val,uint radix)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (val == 0) {
    buf[0] = '0';
    buf[1] = '\0';
  }
  else {
    uVar5 = (ulong)radix;
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      buf[uVar4] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[val % uVar5];
      uVar3 = uVar4 + 1;
      bVar6 = uVar5 <= val;
      val = val / uVar5;
    } while (bVar6);
    buf[uVar3 & 0xffffffff] = '\0';
    if (uVar3 != 1) {
      lVar2 = 0;
      do {
        uVar3 = uVar4 - 1;
        cVar1 = buf[lVar2];
        buf[lVar2] = buf[uVar4];
        lVar2 = lVar2 + 1;
        buf[uVar4] = cVar1;
        uVar4 = uVar3;
      } while (lVar2 < (long)uVar3);
    }
  }
  return buf;
}

Assistant:

char* xultoa(char* buf, unsigned long val, unsigned radix)
{
    int l = 0;
    int r = 0;
    char c;

    if (!val)
    {
        buf[0] = '0';
        buf[1] = '\0';
        return buf;
    }

    do
    {
        buf[r++] = g_xstr_i2c_table[val % radix];
        val /= radix;
    }
    while (val);

    buf[r--] = '\0';

    /* string reverse */
    while (l < r)
    {
        c = buf[l];
        buf[l++] = buf[r];
        buf[r--] = c;
    }

    return buf;
}